

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O3

void singlylinkedlist_destroy(SINGLYLINKEDLIST_HANDLE list)

{
  LIST_ITEM_INSTANCE *__ptr;
  
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    return;
  }
  while (__ptr = list->head, __ptr != (LIST_ITEM_INSTANCE *)0x0) {
    list->head = (LIST_ITEM_INSTANCE *)__ptr->next;
    free(__ptr);
  }
  free(list);
  return;
}

Assistant:

void singlylinkedlist_destroy(SINGLYLINKEDLIST_HANDLE list)
{
    /* Codes_SRS_LIST_01_004: [If the list argument is NULL, no freeing of resources shall occur.] */
    if (list != NULL)
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;

        while (list_instance->head != NULL)
        {
            LIST_ITEM_INSTANCE* current_item = list_instance->head;
            list_instance->head = (LIST_ITEM_INSTANCE*)current_item->next;
            free(current_item);
            current_item = NULL;
        }

        /* Codes_SRS_LIST_01_003: [singlylinkedlist_destroy shall free all resources associated with the list identified by the handle argument.] */
        free(list_instance);
    }
}